

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_349b6b::HandleDifferentCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  char *__s;
  bool bVar2;
  char *pcVar3;
  int iVar4;
  cmAlphaNum *this_00;
  ulong uVar5;
  string_view value;
  allocator<char> local_d1;
  cmExecutionStatus *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  iVar4 = 1;
  local_c8 = (char *)0x0;
  local_c0 = (char *)0x0;
  local_b8 = (char *)0x0;
  uVar5 = 1;
  local_d0 = status;
  do {
    __s = local_b8;
    pcVar3 = local_c0;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar5) {
      if (local_b8 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"DIFFERENT not given result variable name.",
                   (allocator<char> *)&local_80);
        std::__cxx11::string::_M_assign((string *)&local_d0->Error);
      }
      else {
        if ((local_c8 != (char *)0x0) && (local_c0 != (char *)0x0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,local_c8,(allocator<char> *)&local_50);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar3,&local_d1);
          bVar2 = cmsys::SystemTools::FilesDiffer((string *)&local_b0,(string *)&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_b0);
          this = local_d0->Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,__s,(allocator<char> *)&local_80);
          pcVar3 = "0";
          if (bVar2) {
            pcVar3 = "1";
          }
          value._M_str = pcVar3;
          value._M_len = 1;
          cmMakefile::AddDefinition(this,(string *)&local_b0,value);
          std::__cxx11::string::~string((string *)&local_b0);
          return true;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"DIFFERENT not given FILES option with two file names.",
                   (allocator<char> *)&local_80);
        std::__cxx11::string::_M_assign((string *)&local_d0->Error);
      }
      this_00 = &local_b0;
LAB_001ac8db:
      std::__cxx11::string::~string((string *)this_00);
      return false;
    }
    bVar2 = std::operator==(pbVar1 + uVar5,"FILES");
    if (bVar2) {
      iVar4 = 2;
    }
    else {
      if (iVar4 == 3) {
        local_c0 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar5]._M_dataplus._M_p;
      }
      else {
        if (iVar4 == 2) {
          local_c8 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar5]._M_dataplus._M_p;
          iVar4 = 3;
          goto LAB_001ac7bd;
        }
        if (iVar4 != 1) {
          local_b0.View_._M_len = 0x21;
          local_b0.View_._M_str = "DIFFERENT given unknown argument ";
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_80.View_._M_str = pbVar1[uVar5]._M_dataplus._M_p;
          local_80.View_._M_len = pbVar1[uVar5]._M_string_length;
          cmStrCat<>(&local_50,&local_b0,&local_80);
          std::__cxx11::string::_M_assign((string *)&local_d0->Error);
          this_00 = (cmAlphaNum *)&local_50;
          goto LAB_001ac8db;
        }
        local_b8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar5]._M_dataplus._M_p;
      }
      iVar4 = 0;
    }
LAB_001ac7bd:
    uVar5 = (ulong)((int)uVar5 + 1);
  } while( true );
}

Assistant:

bool HandleDifferentCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  /*
    FILE(DIFFERENT <variable> FILES <lhs> <rhs>)
   */

  // Evaluate arguments.
  const char* file_lhs = nullptr;
  const char* file_rhs = nullptr;
  const char* var = nullptr;
  enum Doing
  {
    DoingNone,
    DoingVar,
    DoingFileLHS,
    DoingFileRHS
  };
  Doing doing = DoingVar;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "FILES") {
      doing = DoingFileLHS;
    } else if (doing == DoingVar) {
      var = args[i].c_str();
      doing = DoingNone;
    } else if (doing == DoingFileLHS) {
      file_lhs = args[i].c_str();
      doing = DoingFileRHS;
    } else if (doing == DoingFileRHS) {
      file_rhs = args[i].c_str();
      doing = DoingNone;
    } else {
      status.SetError(cmStrCat("DIFFERENT given unknown argument ", args[i]));
      return false;
    }
  }
  if (!var) {
    status.SetError("DIFFERENT not given result variable name.");
    return false;
  }
  if (!file_lhs || !file_rhs) {
    status.SetError("DIFFERENT not given FILES option with two file names.");
    return false;
  }

  // Compare the files.
  const char* result =
    cmSystemTools::FilesDiffer(file_lhs, file_rhs) ? "1" : "0";
  status.GetMakefile().AddDefinition(var, result);
  return true;
}